

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

int Acb_NtkObjMffcEstimate(Acb_Ntk_t *pNtk,int iObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  
  if (iObj < 1) {
LAB_0037fbc1:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  iVar1 = (pNtk->vObjFans).nSize;
  if (iVar1 <= iObj) {
LAB_0037fbe0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar4 = (pNtk->vObjFans).pArray;
  iVar6 = piVar4[(uint)iObj];
  lVar7 = (long)iVar6;
  if ((lVar7 < 0) || (iVar2 = (pNtk->vFanSto).nSize, iVar2 <= iVar6)) {
LAB_0037fba2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar5 = (pNtk->vFanSto).pArray;
  if ((long)piVar5[lVar7] < 1) {
    iVar6 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar3 = piVar5[lVar7 + lVar8 + 1];
      lVar10 = (long)(int)uVar3;
      if (lVar10 < 1) goto LAB_0037fb64;
      if ((pNtk->vObjType).nSize <= (int)uVar3) goto LAB_0037fb45;
      if ((pNtk->vObjType).pArray[lVar10] != '\x03') {
        if ((pNtk->vFanouts).nSize <= (int)uVar3) goto LAB_0037fb83;
        bVar11 = (pNtk->vFanouts).pArray[lVar10].nSize == 1;
        if (bVar11) {
          uVar9 = uVar3;
        }
        iVar6 = iVar6 + (uint)bVar11;
      }
      lVar8 = lVar8 + 1;
    } while (piVar5[lVar7] != lVar8);
    if (iVar6 == 1) {
      if ((int)uVar9 < 1) goto LAB_0037fbc1;
      if (iVar1 <= (int)uVar9) goto LAB_0037fbe0;
      iVar1 = piVar4[uVar9];
      lVar7 = (long)iVar1;
      if ((lVar7 < 0) || (iVar2 <= iVar1)) goto LAB_0037fba2;
      if ((long)piVar5[lVar7] < 1) {
        iVar6 = 1;
      }
      else {
        iVar6 = 1;
        lVar8 = 0;
        do {
          iVar1 = piVar5[lVar7 + lVar8 + 1];
          lVar10 = (long)iVar1;
          if (lVar10 < 1) {
LAB_0037fb64:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((pNtk->vObjType).nSize <= iVar1) {
LAB_0037fb45:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((pNtk->vObjType).pArray[lVar10] != '\x03') {
            if ((pNtk->vFanouts).nSize <= iVar1) {
LAB_0037fb83:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if ((pNtk->vFanouts).pArray[lVar10].nSize == 1) {
              iVar6 = iVar6 + 1;
            }
          }
          lVar8 = lVar8 + 1;
        } while (piVar5[lVar7] != lVar8);
      }
    }
  }
  return iVar6;
}

Assistant:

static inline int Acb_NtkObjMffcEstimate( Acb_Ntk_t * pNtk, int iObj )
{
    int k, iFanin, * pFanins, Count = 0, iFaninCrit = -1;
    Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            iFaninCrit = iFanin, Count++;
    if ( Count != 1 )
        return Count;
    Acb_ObjForEachFaninFast( pNtk, iFaninCrit, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            Count++;
    return Count;
}